

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  size_type *psVar1;
  Error EVar2;
  uint uVar3;
  Error extraout_EAX;
  CodeHolder *pCVar4;
  CodeHolder *extraout_RAX;
  void *pvVar5;
  size_t __n;
  size_t extraout_RDX;
  CodeHolder *pCVar6;
  CodeHolder *pCVar7;
  CodeHolder *pCVar8;
  long lVar9;
  long lVar10;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar2 = 2;
  }
  else if ((byte)(emitter->_emitterType + ~kCompiler) < 0xfd) {
    EVar2 = 3;
  }
  else {
    uVar3._0_1_ = (this->_environment)._arch;
    uVar3._1_1_ = (this->_environment)._subArch;
    uVar3._2_1_ = (this->_environment)._vendor;
    uVar3._3_1_ = (this->_environment)._platform;
    pvVar5 = (void *)(ulong)uVar3;
    if ((emitter->_archMask >> ((ulong)pvVar5 & 0x3f) & 1) == 0) {
      EVar2 = 4;
    }
    else if (emitter->_code == (CodeHolder *)0x0) {
      if ((this->_emitters).super_ZoneVectorBase._capacity ==
          (this->_emitters).super_ZoneVectorBase._size) {
        pvVar5 = (void *)0x1;
        EVar2 = ZoneVectorBase::_grow(&(this->_emitters).super_ZoneVectorBase,&this->_allocator,8,1)
        ;
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      pCVar6 = this;
      pCVar8 = (CodeHolder *)emitter;
      EVar2 = (*emitter->_vptr_BaseEmitter[0x10])();
      if (EVar2 == 0) {
        if (emitter->_code == this) {
          uVar3 = (this->_emitters).super_ZoneVectorBase._size;
          if (uVar3 < (this->_emitters).super_ZoneVectorBase._capacity) {
            *(BaseEmitter **)((long)(this->_emitters).super_ZoneVectorBase._data + (ulong)uVar3 * 8)
                 = emitter;
            psVar1 = &(this->_emitters).super_ZoneVectorBase._size;
            *psVar1 = *psVar1 + 1;
            return 0;
          }
        }
        else {
          attach();
        }
        attach();
        if (pCVar6 == (CodeHolder *)0x0) {
          EVar2 = 2;
        }
        else if ((CodeHolder *)pCVar6->_logger == pCVar8) {
          if ((char)*(EmitterFlags *)((long)(pCVar6->_cpuFeatures)._data._bits._data + 1) < '\0') {
            EVar2 = 0;
            pCVar7 = pCVar6;
          }
          else {
            pCVar7 = pCVar8;
            EVar2 = (**(_func_int **)((long)pCVar6->_environment + 0x88))(pCVar6);
          }
          uVar3 = (pCVar8->_emitters).super_ZoneVectorBase._size;
          pCVar4 = (CodeHolder *)(ulong)uVar3;
          if (pCVar4 != (CodeHolder *)0x0) {
            pvVar5 = (pCVar8->_emitters).super_ZoneVectorBase._data;
            __n = (ulong)(uVar3 - 1) << 3;
            pCVar7 = (CodeHolder *)0x0;
            do {
              if (*(CodeHolder **)((long)pvVar5 + (long)pCVar7 * 8) == pCVar6) goto LAB_0011807b;
              pCVar7 = (CodeHolder *)&(pCVar7->_environment)._subArch;
              __n = __n - 8;
            } while (pCVar4 != pCVar7);
          }
          do {
            detach();
            pCVar4 = extraout_RAX;
            __n = extraout_RDX;
LAB_0011807b:
            lVar9 = 0xffffffff;
          } while (pCVar7 == (CodeHolder *)0xffffffff);
          if (pCVar4 <= pCVar7) {
            detach();
            *(CodeHolder **)(lVar9 + 0x30) = pCVar7;
            uVar3 = *(uint *)(lVar9 + 200);
            EVar2 = extraout_EAX;
            if ((ulong)uVar3 != 0) {
              lVar9 = *(long *)(lVar9 + 0xc0);
              lVar10 = 0;
              do {
                EVar2 = (**(code **)(**(long **)(lVar9 + lVar10) + 0x90))();
                lVar10 = lVar10 + 8;
              } while ((ulong)uVar3 << 3 != lVar10);
            }
            return EVar2;
          }
          uVar3 = (int)pCVar4 - 1;
          (pCVar8->_emitters).super_ZoneVectorBase._size = uVar3;
          if ((CodeHolder *)(ulong)uVar3 != pCVar7) {
            memmove((void *)((long)pvVar5 + (long)pCVar7 * 8),
                    (void *)((long)pvVar5 + (long)pCVar7 * 8 + 8),__n);
          }
          pCVar6->_logger = (Logger *)0x0;
        }
        else {
          EVar2 = 3;
        }
        return EVar2;
      }
    }
    else {
      EVar2 = (uint)(emitter->_code != this) * 3;
    }
  }
  return EVar2;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  EmitterType type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == EmitterType::kNone || uint32_t(type) > uint32_t(EmitterType::kMaxValue)))
    return DebugUtils::errored(kErrorInvalidState);

  uint64_t archMask = emitter->_archMask;
  if (ASMJIT_UNLIKELY(!(archMask & (uint64_t(1) << uint32_t(arch())))))
    return DebugUtils::errored(kErrorInvalidArch);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}